

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O1

void __thiscall
QPDFPageObjectHelper::externalizeInlineImages
          (QPDFPageObjectHelper *this,size_t min_size,bool shallow)

{
  _Atomic_word *p_Var1;
  bool bVar2;
  QPDF *qpdf;
  undefined7 in_register_00000011;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  QPDFObjectHandle resources;
  Pl_Buffer b;
  InlineImageTracker iit;
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [16];
  undefined1 local_190 [32];
  QPDFObjectHandle local_170 [2];
  undefined1 local_150 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_128;
  undefined1 local_120 [24];
  undefined1 local_108 [8];
  Pl_Buffer local_100;
  InlineImageTracker local_c8;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  if ((int)CONCAT71(in_register_00000011,shallow) == 0) {
    externalizeInlineImages(this,min_size,true);
    local_48._8_8_ = 0;
    pcStack_30 = std::
                 _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFPageObjectHelper.cc:436:19)>
                 ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFPageObjectHelper.cc:436:19)>
               ::_M_manager;
    local_48._M_unused._M_member_pointer = min_size;
    forEachFormXObject(this,true,
                       (function<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
  }
  else {
    local_c8.super_TokenFilter._vptr_TokenFilter = (_func_int **)&local_c8.qpdf;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"/Resources","");
    getAttribute((QPDFPageObjectHelper *)local_150,(string *)this,SUB81(&local_c8,0));
    if ((QPDF **)local_c8.super_TokenFilter._vptr_TokenFilter != &local_c8.qpdf) {
      operator_delete(local_c8.super_TokenFilter._vptr_TokenFilter,
                      (ulong)((long)&((local_c8.qpdf)->m)._M_t.
                                     super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                     .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl + 1
                             ));
    }
    operator____qpdf(local_120 + 0x10,0x26b253);
    QPDFObjectHandle::mergeResources
              ((QPDFObjectHandle *)local_150,(QPDFObjectHandle *)(local_120 + 0x10),
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                *)0x0);
    if (local_108 != (undefined1  [8])0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108);
    }
    local_100.super_Pipeline._vptr_Pipeline =
         (_func_int **)
         (this->super_QPDFObjectHelper).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_100.super_Pipeline.identifier._M_dataplus._M_p =
         (pointer)(this->super_QPDFObjectHelper).super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((Pipeline *)local_100.super_Pipeline.identifier._M_dataplus._M_p != (Pipeline *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(((Pipeline *)local_100.super_Pipeline.identifier._M_dataplus._M_p)->identifier).
                 _M_dataplus._M_p =
             *(int *)&(((Pipeline *)local_100.super_Pipeline.identifier._M_dataplus._M_p)->
                      identifier)._M_dataplus._M_p + 1;
        UNLOCK();
      }
      else {
        *(int *)&(((Pipeline *)local_100.super_Pipeline.identifier._M_dataplus._M_p)->identifier).
                 _M_dataplus._M_p =
             *(int *)&(((Pipeline *)local_100.super_Pipeline.identifier._M_dataplus._M_p)->
                      identifier)._M_dataplus._M_p + 1;
      }
    }
    local_c8.qpdf = QPDFObjectHandle::getOwningQPDF((QPDFObjectHandle *)(local_108 + 8));
    if ((element_type *)local_150._8_8_ != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_150._8_8_ + 8) = *(_Atomic_word *)(local_150._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_150._8_8_ + 8) = *(_Atomic_word *)(local_150._8_8_ + 8) + 1;
      }
      if ((element_type *)local_150._8_8_ != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_150._8_8_ + 8) = *(_Atomic_word *)(local_150._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_150._8_8_ + 8) = *(_Atomic_word *)(local_150._8_8_ + 8) + 1;
        }
      }
    }
    local_c8.super_TokenFilter._vptr_TokenFilter = (_func_int **)&PTR__InlineImageTracker_002f2f58;
    local_c8.dict_str._M_dataplus._M_p = (pointer)&local_c8.dict_str.field_2;
    local_c8.dict_str._M_string_length = 0;
    local_c8.dict_str.field_2._M_local_buf[0] = '\0';
    local_c8.bi_str._M_dataplus._M_p = (pointer)&local_c8.bi_str.field_2;
    local_c8.bi_str._M_string_length = 0;
    local_c8.bi_str.field_2._M_local_buf[0] = '\0';
    local_c8.min_suffix = 1;
    local_c8.any_images = false;
    local_c8.state = st_top;
    local_c8.min_size = min_size;
    if ((element_type *)local_150._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_);
    }
    if ((Pipeline *)local_100.super_Pipeline.identifier._M_dataplus._M_p != (Pipeline *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_100.super_Pipeline.identifier._M_dataplus._M_p);
    }
    Pl_Buffer::Pl_Buffer((Pl_Buffer *)(local_108 + 8),"new page content",(Pipeline *)0x0);
    filterContents(this,&local_c8.super_TokenFilter,(Pipeline *)(local_108 + 8));
    if (local_c8.any_images == true) {
      local_1c0._0_8_ =
           (this->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_1c0._8_8_ =
           (this->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_)->_M_use_count + 1;
        }
      }
      bVar2 = QPDFObjectHandle::isFormXObject((QPDFObjectHandle *)local_1c0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_);
      }
      if (bVar2) {
        local_1c0._0_8_ =
             (this->super_QPDFObjectHelper).super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_1c0._8_8_ =
             (this->super_QPDFObjectHelper).super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_)->_M_use_count + 1
            ;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_)->_M_use_count + 1
            ;
          }
        }
        Pl_Buffer::getBufferSharedPointer((Pl_Buffer *)local_120);
        QPDFObjectHandle::newNull();
        QPDFObjectHandle::newNull();
        QPDFObjectHandle::replaceStreamData
                  ((QPDFObjectHandle *)local_1c0,(shared_ptr<Buffer> *)local_120,
                   (QPDFObjectHandle *)local_1a0,local_170);
        if (local_170[0].super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_170[0].super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._8_8_);
        }
        this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._8_8_);
          this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_;
        }
      }
      else {
        local_170[0].super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (this->super_QPDFObjectHelper).super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_170[0].super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi =
             (this->super_QPDFObjectHelper).super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (local_170[0].super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_170[0].super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_170[0].super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_170[0].super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_170[0].super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
          }
        }
        local_1c0._0_8_ = (element_type *)local_1b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"/Contents","");
        local_150._16_8_ =
             (this->super_QPDFObjectHelper).super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_150._24_8_ =
             (this->super_QPDFObjectHelper).super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if ((element_type *)local_150._24_8_ != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = (_Atomic_word *)
                     ((long)&(((element_type *)local_150._24_8_)->value).
                             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             .
                             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             .
                             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             .
                             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             .
                             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     + 8);
            *p_Var1 = *p_Var1 + 1;
            UNLOCK();
          }
          else {
            p_Var1 = (_Atomic_word *)
                     ((long)&(((element_type *)local_150._24_8_)->value).
                             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             .
                             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             .
                             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             .
                             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             .
                             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     + 8);
            *p_Var1 = *p_Var1 + 1;
          }
        }
        local_1a0._0_8_ = (element_type *)local_190;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"");
        qpdf = QPDFObjectHandle::getQPDF((QPDFObjectHandle *)(local_150 + 0x10),(string *)local_1a0)
        ;
        Pl_Buffer::getBufferSharedPointer((Pl_Buffer *)(local_150 + 0x20));
        QPDFObjectHandle::newStream
                  ((QPDFObjectHandle *)(local_190 + 0x10),qpdf,
                   (shared_ptr<Buffer> *)(local_150 + 0x20));
        QPDFObjectHandle::replaceKey
                  (local_170,(string *)local_1c0,(QPDFObjectHandle *)(local_190 + 0x10));
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._24_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._24_8_);
        }
        if (local_128 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128);
        }
        if ((element_type *)local_1a0._0_8_ != (element_type *)local_190) {
          operator_delete((void *)local_1a0._0_8_,local_190._0_8_ + 1);
        }
        if ((element_type *)local_150._24_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._24_8_);
        }
        this_00._M_pi =
             local_170[0].super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if ((element_type *)local_1c0._0_8_ != (element_type *)local_1b0) {
          operator_delete((void *)local_1c0._0_8_,local_1b0._0_8_ + 1);
          this_00._M_pi =
               local_170[0].super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        }
      }
      if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
      }
    }
    Pl_Buffer::~Pl_Buffer((Pl_Buffer *)(local_108 + 8));
    anon_unknown.dwarf_66e915::InlineImageTracker::~InlineImageTracker(&local_c8);
    if ((element_type *)local_150._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_);
    }
  }
  return;
}

Assistant:

void
QPDFPageObjectHelper::externalizeInlineImages(size_t min_size, bool shallow)
{
    if (shallow) {
        QPDFObjectHandle resources = getAttribute("/Resources", true);
        // Calling mergeResources also ensures that /XObject becomes direct and is not shared with
        // other pages.
        resources.mergeResources("<< /XObject << >> >>"_qpdf);
        InlineImageTracker iit(oh().getOwningQPDF(), min_size, resources);
        Pl_Buffer b("new page content");
        bool filtered = false;
        try {
            filterContents(&iit, &b);
            filtered = true;
        } catch (std::exception& e) {
            oh().warnIfPossible(
                std::string("Unable to filter content stream: ") + e.what() +
                "; not attempting to externalize inline images from this stream");
        }
        if (filtered && iit.any_images) {
            if (oh().isFormXObject()) {
                oh().replaceStreamData(
                    b.getBufferSharedPointer(),
                    QPDFObjectHandle::newNull(),
                    QPDFObjectHandle::newNull());
            } else {
                oh().replaceKey(
                    "/Contents",
                    QPDFObjectHandle::newStream(&oh().getQPDF(), b.getBufferSharedPointer()));
            }
        }
    } else {
        externalizeInlineImages(min_size, true);
        forEachFormXObject(
            true, [min_size](QPDFObjectHandle& obj, QPDFObjectHandle&, std::string const&) {
                QPDFPageObjectHelper(obj).externalizeInlineImages(min_size, true);
            });
    }
}